

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O0

class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
 pybind11::
 bind_map<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>
           (handle scope,string *name)

{
  type_info *f;
  constructor<> *init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  PyObject *in_RSI;
  handle in_RDI;
  bool local;
  type_info *tinfo;
  Class_ *cl;
  class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
  *this;
  byte local_91;
  byte local_79;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar1;
  type_index in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  type_index in_stack_ffffffffffffffd8;
  handle hVar2;
  
  hVar2.m_ptr = in_RDI.m_ptr;
  std::type_index::type_index
            ((type_index *)&stack0xffffffffffffffd8,
             (type_info *)
             &std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::typeinfo);
  f = detail::get_type_info((type_index *)hVar2.m_ptr,SUB81((ulong)in_RSI >> 0x38,0));
  local_79 = 1;
  if (f != (type_info *)0x0) {
    local_79 = (byte)f->field_0x90 >> 3 & 1;
  }
  if (local_79 != 0) {
    std::type_index::type_index
              ((type_index *)&stack0xffffffffffffffc8,(type_info *)&unsigned_long::typeinfo);
    f = detail::get_type_info((type_index *)hVar2.m_ptr,SUB81((ulong)in_RSI >> 0x38,0));
    local_91 = 1;
    local_79 = local_91;
    if (f != (type_info *)0x0) {
      local_79 = (byte)f->field_0x90 >> 3 & 1;
    }
  }
  uVar1 = 0;
  hVar2.m_ptr = in_RSI;
  init = (constructor<> *)std::__cxx11::string::c_str();
  this = (class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
          *)&stack0xffffffffffffffb7;
  module_local::module_local((module_local *)this,(bool)(local_79 & 1));
  class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
  ::class_<pybind11::module_local>
            ((class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
              *)in_RDX,hVar2,(char *)f,(module_local *)in_stack_ffffffffffffffd8._M_target);
  init<>();
  class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
  ::def<>(this,init);
  detail::
  map_if_insertion_operator<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,pybind11::class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>,pybind11::class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>,std::__cxx11::string>
            ((class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
              *)in_RDI.m_ptr,in_RDX);
  class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>
  ::
  def<pybind11::bind_map<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>(pybind11::handle,std::__cxx11::string_const&)::_lambda(std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&)_1_,char[34]>
            ((class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
              *)CONCAT17(local_79,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8._M_target,
             (type *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),(char (*) [34])in_RSI);
  class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>
  ::
  def<pybind11::bind_map<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>(pybind11::handle,std::__cxx11::string_const&)::_lambda(std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>&)_1_,pybind11::keep_alive<0ul,1ul>>
            ((class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
              *)CONCAT17(local_79,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8._M_target,
             (type *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),(keep_alive<0UL,_1UL> *)in_RSI);
  class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>
  ::
  def<pybind11::bind_map<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>(pybind11::handle,std::__cxx11::string_const&)::_lambda(std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>&)_2_,pybind11::keep_alive<0ul,1ul>>
            ((class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
              *)CONCAT17(local_79,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8._M_target,
             (type *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),(keep_alive<0UL,_1UL> *)in_RSI);
  class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>
  ::
  def<pybind11::bind_map<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>(pybind11::handle,std::__cxx11::string_const&)::_lambda(std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>&,unsigned_long_const&)_1_,pybind11::return_value_policy>
            ((class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
              *)CONCAT17(local_79,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8._M_target,
             (type *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),(return_value_policy *)in_RSI);
  class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>
  ::
  def<pybind11::bind_map<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>(pybind11::handle,std::__cxx11::string_const&)::_lambda(std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>&,unsigned_long_const&)_2_>
            ((class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
              *)CONCAT17(local_79,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8._M_target,
             (type *)CONCAT17(uVar1,in_stack_ffffffffffffffc0));
  detail::
  map_assignment<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,pybind11::class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>>
            (this);
  class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>
  ::
  def<pybind11::bind_map<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>(pybind11::handle,std::__cxx11::string_const&)::_lambda(std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>&,unsigned_long_const&)_3_>
            ((class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
              *)CONCAT17(local_79,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8._M_target,
             (type *)CONCAT17(uVar1,in_stack_ffffffffffffffc0));
  class_<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::unique_ptr<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::default_delete<std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>>>
  ::
  def<unsigned_long(std::map<unsigned_long,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>::*)()const>
            ((class_<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::unique_ptr<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>_>
              *)hVar2.m_ptr,(char *)in_RDX,
             (offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr *)f);
  return (generic_type)(generic_type)in_RDI.m_ptr;
}

Assistant:

class_<Map, holder_type> bind_map(handle scope, const std::string &name, Args&&... args) {
    using KeyType = typename Map::key_type;
    using MappedType = typename Map::mapped_type;
    using Class_ = class_<Map, holder_type>;

    // If either type is a non-module-local bound type then make the map binding non-local as well;
    // otherwise (e.g. both types are either module-local or converting) the map will be
    // module-local.
    auto tinfo = detail::get_type_info(typeid(MappedType));
    bool local = !tinfo || tinfo->module_local;
    if (local) {
        tinfo = detail::get_type_info(typeid(KeyType));
        local = !tinfo || tinfo->module_local;
    }

    Class_ cl(scope, name.c_str(), pybind11::module_local(local), std::forward<Args>(args)...);

    cl.def(init<>());

    // Register stream insertion operator (if possible)
    detail::map_if_insertion_operator<Map, Class_>(cl, name);

    cl.def("__bool__",
        [](const Map &m) -> bool { return !m.empty(); },
        "Check whether the map is nonempty"
    );

    cl.def("__iter__",
           [](Map &m) { return make_key_iterator(m.begin(), m.end()); },
           keep_alive<0, 1>() /* Essential: keep list alive while iterator exists */
    );

    cl.def("items",
           [](Map &m) { return make_iterator(m.begin(), m.end()); },
           keep_alive<0, 1>() /* Essential: keep list alive while iterator exists */
    );

    cl.def("__getitem__",
        [](Map &m, const KeyType &k) -> MappedType & {
            auto it = m.find(k);
            if (it == m.end())
              throw key_error();
           return it->second;
        },
        return_value_policy::reference_internal // ref + keepalive
    );

    cl.def("__contains__",
        [](Map &m, const KeyType &k) -> bool {
            auto it = m.find(k);
            if (it == m.end())
              return false;
           return true;
        }
    );

    // Assignment provided only if the type is copyable
    detail::map_assignment<Map, Class_>(cl);

    cl.def("__delitem__",
           [](Map &m, const KeyType &k) {
               auto it = m.find(k);
               if (it == m.end())
                   throw key_error();
               m.erase(it);
           }
    );

    cl.def("__len__", &Map::size);

    return cl;
}